

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3LockAndPrepare
              (sqlite3 *db,char *zSql,int nBytes,u32 prepFlags,Vdbe *pOld,sqlite3_stmt **ppStmt,
              char **pzTail)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long in_RSI;
  sqlite3_stmt **in_RDI;
  undefined8 *in_R9;
  u32 unaff_retaddr;
  int unaff_retaddr_00;
  sqlite3 *in_stack_00000008;
  int cnt;
  int rc;
  char **in_stack_000001d0;
  sqlite3 *in_stack_ffffffffffffffb8;
  sqlite3 *db_00;
  uint6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  int local_38;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_38 = 0;
  *in_R9 = 0;
  iVar2 = sqlite3SafetyCheckOk(in_stack_ffffffffffffffb8);
  if ((iVar2 == 0) || (in_RSI == 0)) {
    iVar2 = sqlite3MisuseError(0);
  }
  else {
    sqlite3_mutex_enter((sqlite3_mutex *)0x146079);
    sqlite3BtreeEnterAll((sqlite3 *)0x146083);
    do {
      db_00 = in_stack_00000008;
      iVar2 = sqlite3Prepare(_cnt,(char *)in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                             (Vdbe *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             in_RDI,in_stack_000001d0);
      if ((iVar2 == 0) || (*(char *)((long)in_RDI + 0x67) != '\0')) break;
      if (iVar2 == 0x201) {
        iVar3 = local_38 + 1;
        in_stack_ffffffffffffffc7 = true;
        bVar1 = 0x18 < local_38;
        local_38 = iVar3;
        if (bVar1) goto LAB_001460ec;
      }
      else {
LAB_001460ec:
        iVar3 = local_38;
        if (iVar2 == 0x11) {
          sqlite3ResetOneSchema
                    ((sqlite3 *)CONCAT17(in_stack_ffffffffffffffc7,(uint7)in_stack_ffffffffffffffc0)
                     ,(int)((ulong)db_00 >> 0x20));
          local_38 = local_38 + 1;
        }
        in_stack_ffffffffffffffc7 = iVar2 == 0x11 && iVar3 == 0;
      }
    } while ((bool)in_stack_ffffffffffffffc7 != false);
    sqlite3BtreeLeaveAll((sqlite3 *)0x14613d);
    iVar2 = sqlite3ApiExit(db_00,0);
    *(undefined4 *)(in_RDI + 0x52) = 0;
    sqlite3_mutex_leave((sqlite3_mutex *)0x14616c);
  }
  return iVar2;
}

Assistant:

static int sqlite3LockAndPrepare(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  Vdbe *pOld,               /* VM being reprepared */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  int rc;
  int cnt = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppStmt==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppStmt = 0;
  if( !sqlite3SafetyCheckOk(db)||zSql==0 ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  do{
    /* Make multiple attempts to compile the SQL, until it either succeeds
    ** or encounters a permanent error.  A schema problem after one schema
    ** reset is considered a permanent error. */
    rc = sqlite3Prepare(db, zSql, nBytes, prepFlags, pOld, ppStmt, pzTail);
    assert( rc==SQLITE_OK || *ppStmt==0 );
    if( rc==SQLITE_OK || db->mallocFailed ) break;
  }while( (rc==SQLITE_ERROR_RETRY && (cnt++)<SQLITE_MAX_PREPARE_RETRY)
       || (rc==SQLITE_SCHEMA && (sqlite3ResetOneSchema(db,-1), cnt++)==0) );
  sqlite3BtreeLeaveAll(db);
  rc = sqlite3ApiExit(db, rc);
  assert( (rc&db->errMask)==rc );
  db->busyHandler.nBusy = 0;
  sqlite3_mutex_leave(db->mutex);
  assert( rc==SQLITE_OK || (*ppStmt)==0 );
  return rc;
}